

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void __thiscall Bitmap::drawLine(Bitmap *this,uint32_t y,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint x;
  
  if (height != 0) {
    if (this->width != 0) {
      x = 0;
      do {
        uVar1 = getPixelIndex(this,x,y);
        if (uVar1 < (uint)this->length) {
          uVar2 = uVar1 + 7;
          if (-1 < (int)uVar1) {
            uVar2 = uVar1;
          }
          this->data[(int)uVar2 >> 3] =
               this->data[(int)uVar2 >> 3] | (byte)(0x80 >> ((byte)uVar1 & 7));
        }
        x = x + 1;
      } while (x < this->width);
    }
    duplicateLineDown(this,y,height - 1);
    return;
  }
  return;
}

Assistant:

void Bitmap::drawLine(uint32_t y, uint32_t height)
{
   if (height > 0)
   {
      //draw horizontal line
      for (uint32_t i = 0; i < width; ++i)
      {
         uint32_t pixel = getPixelIndex(i, y);
         setPixelValue(pixel, 1);
      }
      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
   }
}